

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryOutStream.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_19ea3::TestStreamingSizeTWritesCorrectCharacters::RunImpl
          (TestStreamingSizeTWritesCorrectCharacters *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  char *actual;
  TestDetails **ppTVar2;
  TestDetails local_1e0;
  undefined8 local_1b0;
  size_t s;
  MemoryOutStream stream;
  TestStreamingSizeTWritesCorrectCharacters *this_local;
  
  stream._400_8_ = this;
  UnitTest::MemoryOutStream::MemoryOutStream((MemoryOutStream *)&s);
  local_1b0 = 0xcf84;
  std::ostream::operator<<((MemoryOutStream *)&s,0xcf84);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  actual = UnitTest::MemoryOutStream::GetText((MemoryOutStream *)&s);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_1e0,*ppTVar2,0x57);
  UnitTest::CheckEqual(results,"53124",actual,&local_1e0);
  UnitTest::MemoryOutStream::~MemoryOutStream((MemoryOutStream *)&s);
  return;
}

Assistant:

TEST(StreamingSizeTWritesCorrectCharacters)
{
    MemoryOutStream stream;
    size_t const s = 53124;
    stream << s;
    CHECK_EQUAL("53124", stream.GetText());
}